

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

bool NormaliseTrack(CylHead *cylhead,Track *track)

{
  allocator<unsigned_char> *this;
  byte bVar1;
  value_type vVar2;
  initializer_list<ChecksumType> __l;
  Track *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  Data *pDVar6;
  Sector *pSVar7;
  byte *pbVar8;
  Sector *this_01;
  reference this_02;
  reference pvVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  pair<int,_unsigned_char> pVar11;
  uchar *puVar12;
  size_type sVar13;
  reference pCVar14;
  const_reference pvVar15;
  const_reference pvVar16;
  bool local_529;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  _Rb_tree_const_iterator<ChecksumType> local_3d0;
  int local_3c4;
  undefined1 local_3c0 [4];
  int checksum_len;
  undefined1 local_390 [8];
  string str_method;
  key_type local_364;
  _Self local_360;
  char *local_358;
  char *local_350;
  _Self local_348;
  key_type local_33c;
  _Self local_338;
  insert_iterator<std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>
  local_330;
  _Base_ptr local_320;
  insert_iterator<std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>
  local_318;
  _Rb_tree_const_iterator<ChecksumType> local_308;
  _Rb_tree_const_iterator<ChecksumType> local_300;
  _Rb_tree_const_iterator<ChecksumType> local_2f8;
  _Rb_tree_const_iterator<ChecksumType> local_2f0;
  undefined1 auStack_2e8 [8];
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> common_methods;
  ChecksumType local_2ac;
  iterator local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [8];
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> sector_methods;
  mapped_type *disk_methods;
  pair<int,_unsigned_char> key;
  lock_guard<std::mutex> lock;
  Data *data_5;
  Sector *sector_2;
  Data *data_4;
  Sector *s_1;
  iterator __end2;
  iterator __begin2;
  Track *__range2;
  uchar *local_1d8;
  uchar *local_1d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  const_iterator local_1b8;
  uchar *local_1b0;
  uchar *local_1a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  const_iterator local_190;
  allocator<unsigned_char> local_182;
  value_type local_181;
  undefined1 local_180 [8];
  Data fill8;
  undefined1 local_160 [8];
  Data data8;
  Data *data7;
  Sector *sector8;
  Sector *sector7_1;
  Data data_2;
  Data data_3;
  Sector *sector1_1;
  Data data_1;
  Sector *sector7;
  Data data;
  Sector *sector1;
  int weak_size;
  int weak_offset;
  Sector *sector_1;
  int gap3;
  Data local_98;
  Sector local_78;
  Sector *local_38;
  Sector *s;
  Sector *pSStack_28;
  int j;
  Sector *sector;
  int i;
  bool changed;
  Track *track_local;
  CylHead *cylhead_local;
  
  sector._7_1_ = 0;
  if (opt.offsets == 0) {
    track->tracklen = 0;
  }
  _i = track;
  track_local = (Track *)cylhead;
  for (sector._0_4_ = 0; iVar5 = (int)sector, iVar4 = Track::size(_i), iVar5 < iVar4;
      sector._0_4_ = (int)sector + 1) {
    pSStack_28 = Track::operator[](_i,(int)sector);
    iVar5 = (int)sector;
    if (opt.nodups != 0) {
      while( true ) {
        s._4_4_ = iVar5 + 1;
        iVar5 = s._4_4_;
        iVar4 = Track::size(_i);
        if (iVar4 <= iVar5) break;
        local_38 = Track::operator[](_i,s._4_4_);
        bVar3 = Header::compare_chrn(&local_38->header,&pSStack_28->header);
        iVar5 = s._4_4_;
        if ((bVar3) && (local_38->encoding == pSStack_28->encoding)) {
          s._4_4_ = s._4_4_ + -1;
          Track::remove((Track *)&local_78,(char *)_i);
          Sector::~Sector(&local_78);
          sector._7_1_ = 1;
          iVar5 = s._4_4_;
        }
      }
    }
    if ((opt.nodata != 0) && (bVar3 = Sector::has_data(pSStack_28), bVar3)) {
      Sector::remove_data(pSStack_28);
      pSVar7 = pSStack_28;
      local_98.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Data::Data(&local_98);
      Sector::add(pSVar7,&local_98,false,0xfb);
      Data::~Data(&local_98);
      sector._7_1_ = 1;
    }
    if (opt.offsets == 0) {
      pSStack_28->offset = 0;
    }
    bVar3 = Sector::has_gapdata(pSStack_28);
    if (bVar3) {
      if ((opt.gaps == 0) || ((opt.gapmask & 1 << ((byte)(int)sector & 0x1f)) == 0)) {
        Sector::remove_gapdata(pSStack_28,false);
        sector._7_1_ = 1;
      }
      else if ((opt.gaps == 1) && (pSStack_28->encoding == MFM)) {
        sector_1._0_4_ = 0;
        pDVar6 = Sector::data_copy(pSStack_28,0);
        iVar5 = Sector::size(pSStack_28);
        bVar3 = test_remove_gap3(pDVar6,iVar5,(int *)&sector_1);
        if (bVar3) {
          Sector::remove_gapdata(pSStack_28,true);
          sector._7_1_ = 1;
          if (pSStack_28->gap3 == 0) {
            pSStack_28->gap3 = (int)sector_1;
          }
        }
      }
    }
  }
  for (sector._0_4_ = 0; iVar5 = (int)sector, iVar4 = Track::size(_i), iVar5 < iVar4;
      sector._0_4_ = (int)sector + 1) {
    _weak_size = Track::operator[](_i,(int)sector);
    iVar5 = (int)sector;
    iVar4 = Track::size(_i);
    if (((iVar5 == iVar4 + -1) && (opt.gap4b == 0)) &&
       (bVar3 = Sector::has_gapdata(_weak_size), bVar3)) {
      Sector::remove_gapdata(_weak_size,true);
      sector._7_1_ = 1;
    }
    if (opt.datarate != Unknown) {
      _weak_size->datarate = opt.datarate;
      sector._7_1_ = 1;
    }
    if (opt.encoding != Unknown) {
      _weak_size->encoding = opt.encoding;
      sector._7_1_ = 1;
    }
    if (opt.gap3 != -1) {
      _weak_size->gap3 = opt.gap3 & 0xff;
    }
  }
  if (((opt.fix != 0) && (track_local->tracklen == 0)) && (iVar5 = Track::size(_i), iVar5 == 9)) {
    data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Track::operator[](_i,1);
    iVar5 = Sector::copies((Sector *)
                           data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    if ((iVar5 == 1) &&
       (bVar3 = IsSpectrumSpeedlockTrack(_i,(int *)((long)&sector1 + 4),(int *)&sector1), bVar3)) {
      if (opt.fix == 1) {
        pDVar6 = Sector::data_copy((Sector *)
                                   data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        Data::Data((Data *)&sector7,pDVar6);
        for (sector._0_4_ = sector1._4_4_; iVar5 = (int)sector, iVar4 = Data::size((Data *)&sector7)
            , iVar5 < iVar4; sector._0_4_ = (int)sector + 1) {
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector7,
                              (long)(int)sector);
          bVar1 = *pbVar8;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector7,
                              (long)(int)sector);
          *pbVar8 = bVar1 ^ 0xff;
        }
        Sector::add((Sector *)
                    data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(Data *)&sector7,true,0xfb);
        Message<>(msgFix,"added suitable second copy of +3 Speedlock weak sector");
        sector._7_1_ = 1;
        Data::~Data((Data *)&sector7);
      }
      else {
        Message<>(msgWarning,"missing multiple copies of +3 Speedlock weak sector");
      }
    }
    data_1.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Track::operator[](_i,7);
    iVar5 = Sector::copies((Sector *)
                           data_1.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    if ((iVar5 == 1) &&
       (bVar3 = IsCpcSpeedlockTrack(_i,(int *)((long)&sector1 + 4),(int *)&sector1), bVar3)) {
      if (opt.fix == 1) {
        pDVar6 = Sector::data_copy((Sector *)
                                   data_1.
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        Data::Data((Data *)&sector1_1,pDVar6);
        for (sector._0_4_ = sector1._4_4_; iVar5 = (int)sector,
            iVar4 = Data::size((Data *)&sector1_1), iVar5 < iVar4; sector._0_4_ = (int)sector + 1) {
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector1_1,
                              (long)(int)sector);
          bVar1 = *pbVar8;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector1_1,
                              (long)(int)sector);
          *pbVar8 = bVar1 ^ 0xff;
        }
        Sector::add((Sector *)
                    data_1.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(Data *)&sector1_1,true,0xfb);
        Message<>(msgFix,"added suitable second copy of CPC Speedlock weak sector");
        sector._7_1_ = 1;
        Data::~Data((Data *)&sector1_1);
      }
      else {
        Message<>(msgWarning,"missing multiple copies of CPC Speedlock weak sector");
      }
    }
  }
  if (((opt.fix != 0) && (track_local->tracklen == 0x28)) && (iVar5 = Track::size(_i), iVar5 == 9))
  {
    pSVar7 = Track::operator[](_i,1);
    iVar5 = Sector::copies(pSVar7);
    if ((iVar5 == 1) &&
       (bVar3 = IsRainbowArtsTrack(_i,(int *)((long)&sector1 + 4),(int *)&sector1), bVar3)) {
      if (opt.fix == 1) {
        bVar3 = Sector::has_baddatacrc(pSVar7);
        if (!bVar3) {
          pDVar6 = Sector::data_copy(pSVar7,0);
          Data::Data((Data *)&data_2.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,pDVar6);
          Sector::remove_data(pSVar7);
          Sector::add(pSVar7,(Data *)&data_2.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true,0xfb);
          if (opt.debug != 0) {
            util::operator<<((LogHelper *)&util::cout,
                             (char (*) [52])"added missing data CRC error to Rainbow Arts track\n");
          }
          Data::~Data((Data *)&data_2.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        pDVar6 = Sector::data_copy(pSVar7,0);
        Data::Data((Data *)&sector7_1,pDVar6);
        for (sector._0_4_ = sector1._4_4_; iVar5 = (int)sector,
            iVar4 = Data::size((Data *)&sector7_1), iVar5 < iVar4; sector._0_4_ = (int)sector + 1) {
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector7_1,
                              (long)(int)sector);
          bVar1 = *pbVar8;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sector7_1,
                              (long)(int)sector);
          *pbVar8 = bVar1 ^ 0xff;
        }
        Sector::add(pSVar7,(Data *)&sector7_1,true,0xfb);
        Message<>(msgFix,"added suitable second copy of Rainbow Arts weak sector");
        sector._7_1_ = 1;
        Data::~Data((Data *)&sector7_1);
      }
      else {
        Message<>(msgWarning,"missing multiple copies of Rainbow Arts weak sector");
      }
    }
  }
  if (((opt.fix != 0) && (track_local->tracklen == 0x28)) && (iVar5 = Track::size(_i), iVar5 == 9))
  {
    pSVar7 = Track::operator[](_i,7);
    this_01 = Track::operator[](_i,8);
    bVar3 = Sector::has_data(pSVar7);
    if (((bVar3) && (iVar5 = Sector::data_size(this_01), iVar5 == 0)) &&
       (bVar3 = IsOperaSoftTrack(_i), bVar3)) {
      if (opt.fix == 1) {
        data8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)Sector::data_copy(pSVar7,0);
        fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0x55;
        this = (allocator<unsigned_char> *)
               ((long)&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6);
        std::allocator<unsigned_char>::allocator(this);
        Data::vector((Data *)local_160,0x100,
                     (value_type *)
                     ((long)&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),this);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 6));
        fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 0xe8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160,
                   (value_type *)
                   ((long)&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 5));
        fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0x9f;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160,
                   (value_type *)
                   ((long)&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 4));
        iVar5 = Data::size((Data *)local_160);
        local_181 = 'N';
        std::allocator<unsigned_char>::allocator(&local_182);
        Data::vector((Data *)local_180,(long)(0x512 - iVar5),&local_181,&local_182);
        std::allocator<unsigned_char>::~allocator(&local_182);
        local_198._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_190,&local_198);
        local_1a0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180)
        ;
        local_1a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        local_180);
        local_1b0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                        local_160,local_190,local_1a0,
                                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         )local_1a8);
        local_1c0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_1b8,&local_1c0);
        local_1c8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 data8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_1d0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        data8.
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_1d8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                        local_160,local_1b8,local_1c8,
                                        (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         )local_1d0);
        Sector::remove_data(this_01);
        Sector::add(this_01,(Data *)local_160,true,0xfb);
        Message<>(msgFix,"added missing data to OperaSoft 32K sector");
        sector._7_1_ = 1;
        Data::~Data((Data *)local_180);
        Data::~Data((Data *)local_160);
      }
      else {
        Message<>(msgWarning,"missing data in OperaSoft 32K sector");
      }
    }
  }
  if (((opt.fix != 0) && (iVar5 = Track::size(_i), iVar5 == 0xd)) &&
     ((pSVar7 = Track::operator[](_i,6), (pSVar7->header).sector == 0xc &&
      (bVar3 = IsPrehistorikTrack(_i), bVar3)))) {
    if (opt.fix == 1) {
      while (iVar5 = Track::size(_i), 7 < iVar5) {
        Track::remove((Track *)&__range2,(char *)_i);
        Sector::~Sector((Sector *)&__range2);
        sector._7_1_ = 1;
      }
      Message<>(msgFix,"removed unused KBI-19 sectors from end of Prehistorik track");
      sector._7_1_ = 1;
    }
    else {
      Message<>(msgWarning,"6 junk KBI-19 sectors found (use --fix to remove)");
    }
  }
  if ((opt.fix != 0) && (iVar5 = Track::size(_i), this_00 = _i, iVar5 == 10)) {
    __end2 = Track::begin(_i);
    s_1 = (Sector *)Track::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s_1), bVar3) {
      this_02 = __gnu_cxx::
                __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
                operator*(&__end2);
      iVar5 = Sector::size(this_02);
      if ((iVar5 == 0x200) && (bVar3 = Sector::has_good_data(this_02), bVar3)) {
        pvVar10 = &Sector::data_copy(this_02,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar10);
        iVar5 = memcmp(puVar12,"",6);
        if (iVar5 == 0) {
          for (sector._0_4_ = 0; iVar5 = (int)sector, iVar4 = Data::size((Data *)pvVar10),
              iVar5 < iVar4 + -5; sector._0_4_ = (int)sector + 1) {
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (pvVar10,(long)(int)sector);
            if (*pvVar9 == 0xdd) {
              puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar10);
              iVar5 = memcmp(puVar12 + (int)sector,NormaliseTrack::prot_check,5);
              if (iVar5 == 0) {
                if (opt.fix == 1) {
                  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     (pvVar10,(long)((int)sector + 3));
                  *pvVar9 = 0xaf;
                  Message<>(msgFix,"disabled problematic Reussir protection");
                }
                else {
                  Message<>(msgWarning,
                            "detected problematic Reussir protection (use --fix to disable)");
                }
                break;
              }
            }
          }
        }
      }
      __gnu_cxx::__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end2);
    }
  }
  if ((opt.check8k == 0) || (bVar3 = Track::is_8k_sector(_i), !bVar3)) goto LAB_00205a1c;
  pSVar7 = Track::operator[](_i,0);
  iVar5 = Sector::copies(pSVar7);
  if (iVar5 != 1) goto LAB_00205a1c;
  pSVar7 = Track::operator[](_i,0);
  iVar5 = Sector::data_size(pSVar7);
  if (iVar5 < 0x1801) goto LAB_00205a1c;
  pSVar7 = Track::operator[](_i,0);
  pvVar10 = &Sector::data_copy(pSVar7,0)->
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&key,&NormaliseTrack::map_mutex)
  ;
  pVar11 = std::make_pair<int_const&,unsigned_char_const&>(&(pSVar7->header).sector,&pSVar7->dam);
  disk_methods._0_4_ = pVar11.first;
  disk_methods._4_1_ = pVar11.second;
  if ((NormaliseTrack(CylHead_const&,Track&)::methods_map == '\0') &&
     (iVar5 = __cxa_guard_acquire(&NormaliseTrack(CylHead_const&,Track&)::methods_map), iVar5 != 0))
  {
    std::
    map<std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>,_std::less<std::pair<int,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>_>_>
    ::map(&NormaliseTrack::methods_map);
    __cxa_atexit(std::
                 map<std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>,_std::less<std::pair<int,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>_>_>
                 ::~map,&NormaliseTrack::methods_map,&__dso_handle);
    __cxa_guard_release(&NormaliseTrack(CylHead_const&,Track&)::methods_map);
  }
  sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>,_std::less<std::pair<int,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>_>_>
               ::operator[](&NormaliseTrack::methods_map,(key_type *)&disk_methods);
  puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar10);
  iVar5 = Data::size((Data *)pvVar10);
  ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  local_298,puVar12,iVar5);
  bVar3 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::empty
                    ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar3) {
    bVar3 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::empty
                      ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                       local_298);
    if (bVar3) {
      local_2ac = None;
      local_2a8 = &local_2ac;
      local_2a0 = 1;
      __l._M_len = 1;
      __l._M_array = local_2a8;
      std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::operator=
                ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                 sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count,__l);
    }
    else {
      std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::operator=
                ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                 sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                 local_298);
    }
  }
  common_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  common_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  common_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  common_methods._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  common_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auStack_2e8 = (undefined1  [8])0x0;
  common_methods._M_t._M_impl._0_8_ = 0;
  std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::set
            ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
             auStack_2e8);
  local_2f0._M_node =
       (_Base_ptr)
       std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::begin
                 ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  local_298);
  local_2f8._M_node =
       (_Base_ptr)
       std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::end
                 ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  local_298);
  local_300._M_node =
       (_Base_ptr)
       std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::begin
                 ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_308._M_node =
       (_Base_ptr)
       std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::end
                 ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_320 = (_Base_ptr)
              std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::begin
                        ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                          *)auStack_2e8);
  local_318 = std::
              inserter<std::set<ChecksumType,std::less<ChecksumType>,std::allocator<ChecksumType>>>
                        ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                          *)auStack_2e8,(iterator)local_320);
  local_330 = std::
              set_intersection<std::_Rb_tree_const_iterator<ChecksumType>,std::_Rb_tree_const_iterator<ChecksumType>,std::insert_iterator<std::set<ChecksumType,std::less<ChecksumType>,std::allocator<ChecksumType>>>>
                        (local_2f0,local_2f8,local_300,local_308,local_318);
  local_33c = None;
  local_338._M_node =
       (_Base_ptr)
       std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::find
                 ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  local_298,&local_33c);
  local_348._M_node =
       (_Base_ptr)
       std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::end
                 ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  local_298);
  bVar3 = std::operator!=(&local_338,&local_348);
  if (!bVar3) {
    sVar13 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::size
                       ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )auStack_2e8);
    if (sVar13 == 1) {
      sVar13 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::size
                         ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (1 < sVar13) {
        std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::operator=
                  ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                   sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                   auStack_2e8);
      }
    }
    else {
      bVar3 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::empty
                        ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                          *)sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar3) {
        iVar5 = Data::size((Data *)pvVar10);
        if (0x1801 < iVar5) {
          pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar10,0x1800);
          vVar2 = *pvVar15;
          pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar10,0x1801);
          if (vVar2 != *pvVar15) {
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (pvVar10,0x1800);
            pvVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (pvVar10,0x1801);
            local_350 = CH(track_local->tracklen,track_local->tracktime);
            Message<unsigned_char_const&,unsigned_char_const&,char_const*>
                      (msgWarning,"unknown or invalid 6K checksum [%02X %02X] on %s",pvVar15,pvVar16
                       ,&local_350);
            goto LAB_002059d0;
          }
        }
        iVar5 = Data::size((Data *)pvVar10);
        if (0x1800 < iVar5) {
          pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar10,0x1800);
          if (*pvVar15 != '\0') {
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (pvVar10,0x1800);
            local_358 = CH(track_local->tracklen,track_local->tracktime);
            Message<unsigned_char_const&,char_const*>
                      (msgWarning,"unknown or invalid 6K checksum [%02X] on %s",pvVar15,&local_358);
          }
        }
      }
      else {
        sVar13 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                 size((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                      sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_529 = false;
        if (sVar13 == 1) {
          bVar3 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                  empty((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )auStack_2e8);
          local_529 = false;
          if (bVar3) {
            local_364 = None;
            local_360._M_node =
                 (_Base_ptr)
                 std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                 find((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                      sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_364);
            str_method.field_2._8_8_ =
                 std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::end
                           ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                             *)sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_529 = std::operator==(&local_360,(_Self *)((long)&str_method.field_2 + 8));
          }
        }
        if (local_529 != false) {
          std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::set
                    ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     local_3c0,
                     (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ChecksumName_abi_cxx11_
                    ((string *)local_390,
                     (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     local_3c0);
          std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::~set
                    ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     local_3c0);
          local_3d0._M_node =
               (_Base_ptr)
               std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::begin
                         ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)sector_methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pCVar14 = std::_Rb_tree_const_iterator<ChecksumType>::operator*(&local_3d0);
          local_3c4 = ChecksumLength(*pCVar14);
          if (local_3c4 == 1) {
LAB_00205853:
            local_3d8 = (char *)std::__cxx11::string::c_str();
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (pvVar10,0x1800);
            local_3e0 = CH(track_local->tracklen,track_local->tracktime);
            Message<char_const*,unsigned_char_const&,char_const*>
                      (msgWarning,"invalid %s checksum [%02X] on %s",&local_3d8,pvVar15,&local_3e0);
          }
          else {
            iVar5 = Data::size((Data *)pvVar10);
            if (iVar5 < 0x1802) goto LAB_00205853;
            if (local_3c4 == 2) {
              local_3e8 = (char *)std::__cxx11::string::c_str();
              pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar10,0x1800);
              pvVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar10,0x1801);
              local_3f0 = CH(track_local->tracklen,track_local->tracktime);
              Message<char_const*,unsigned_char_const&,unsigned_char_const&,char_const*>
                        (msgWarning,"invalid %s checksum [%02X %02X] on %s",&local_3e8,pvVar15,
                         pvVar16,&local_3f0);
            }
          }
          std::__cxx11::string::~string((string *)local_390);
        }
      }
    }
  }
LAB_002059d0:
  std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::~set
            ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
             auStack_2e8);
  std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::~set
            ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)local_298)
  ;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&key);
LAB_00205a1c:
  return (bool)(sector._7_1_ & 1);
}

Assistant:

bool NormaliseTrack(const CylHead& cylhead, Track& track)
{
    bool changed = false;
    int i;

    // Clear the track length if offsets are disabled (cosmetic: no changed flag).
    if (opt.offsets == 0)
        track.tracklen = 0;

    // Pass 1
    for (i = 0; i < track.size(); ++i)
    {
        auto& sector = track[i];

        // Remove sectors with duplicate CHRN?
        if (opt.nodups)
        {
            // Remove duplicates found later on the track.
            for (int j = i + 1; j < track.size(); ++j)
            {
                auto& s = track[j];
                if (s.header.compare_chrn(sector.header) && s.encoding == sector.encoding)
                {
                    track.remove(j--);
                    changed = true;
                }
            }
        }

        // Clear all data, for privacy during diagnostics?
        if (opt.nodata && sector.has_data())
        {
            sector.remove_data();
            sector.add(Data());     // empty data rather than no data
            changed = true;
        }

        // Track offsets disabled? (cosmetic: no changed flag)
        if (opt.offsets == 0)
            sector.offset = 0;
#if 0
        // ToDo: move this to fdrawcmd disk type
        // Build ASRock corruption check block
        if (i < (int)arraysize(ah))
        {
            ah[i].cyl = sector.header.cyl;
            ah[i].head = sector.header.head;
            ah[i].sector = sector.header.sector;
            ah[i].size = sector.header.size;
        }
#endif

        if (sector.has_gapdata())
        {
            // Remove gap data if disabled, or the gap mask doesn't allow it
            if (opt.gaps == GAPS_NONE || !(opt.gapmask & (1 << i)))
            {
                sector.remove_gapdata();
                changed = true;
            }
            // Remove normal gaps unless we're asked to keep them.
            else if (opt.gaps == GAPS_CLEAN && sector.encoding == Encoding::MFM)
            {
                int gap3 = 0;
                if (test_remove_gap3(sector.data_copy(), sector.size(), gap3))
                {
                    sector.remove_gapdata(true);
                    changed = true;

                    if (!sector.gap3)
                        sector.gap3 = gap3;
                }
            }
        }
#if 0
        // ToDo: move this to affected disk types
        // Check for short sector wrapping the track end (includes logoprof.dmk and Les Justiciers 2 [1B].scp [CPC])
        // Also check it doesn't trigger in cyl 18 sector 5 of Super Sprint (KryoFlux).
        if (ps->uData > 0 && tracklen > 0 && ps->offset > 0 &&
            ps->uData < uSize &&
            GetDataExtent(i) > uSize &&
            (ps->offset + GetSectorOverhead(encrate) + uSize) > tracklen)
        {
            Message(msgWarning, "%s truncated at end of track data", CHSR(cyl, head, i, ps->sector));
        }
#endif
    }

    // Pass 2
    for (i = 0; i < track.size(); ++i)
    {
        Sector& sector = track[i];

        // Remove only the final gap if --no-gap4b was used
        if (i == (track.size() - 1) && opt.gap4b == 0 && sector.has_gapdata())
        {
            sector.remove_gapdata(true);
            changed = true;
        }

        // Allow override for sector datarate.
        if (opt.datarate != DataRate::Unknown)
        {
            sector.datarate = opt.datarate;
            changed = true;
        }

        // Allow override for sector encoding.
        if (opt.encoding != Encoding::Unknown)
        {
            sector.encoding = opt.encoding;
            changed = true;
        }

        // Allow overrides for track gap3 (cosmetic: no changed flag)
        if (opt.gap3 != -1)
            sector.gap3 = static_cast<uint8_t>(opt.gap3);
#if 0
        // ToDo: move this to fdrawcmd disk type
        // Check for the ASRock FDC problem that corrupts sector data with format headers (unless comparison block is all one byte)
        int nn = sizeof(ah) - sizeof(ah[0]) - 1;
        if (sectors > 1 && ps->apbData[0] && memcmp(ps->apbData[0], ps->apbData[0] + 1, sizeof(ah) - 1))
        {
            // Ignore the first sector and size in case of a placeholder sector
            if (!memcmp(&ah[1], ps->apbData[0] + sizeof(ah[0]), sizeof(ah) - sizeof(ah[0])))
                Message(msgWarning, "possible FDC data corruption on %s", CHSR(cyl, head, i, ps->sector));
        }
#endif
    }

    int weak_offset, weak_size;

    // Check for Speedlock weak sector (either +3 or CPC)
    if (opt.fix != 0 && cylhead.cyl == 0 && track.size() == 9)
    {
        auto& sector1 = track[1];
        if (sector1.copies() == 1 && IsSpectrumSpeedlockTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Add a copy with differences matching the typical weak sector
                auto data = sector1.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector1.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of +3 Speedlock weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of +3 Speedlock weak sector");
        }

        auto& sector7 = track[7];
        if (sector7.copies() == 1 && IsCpcSpeedlockTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Add a second data copy with differences matching the typical weak sector
                auto data = sector7.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector7.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of CPC Speedlock weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of CPC Speedlock weak sector");
        }
    }

    // Check for Rainbow Arts weak sector missing copies
    if (opt.fix != 0 && cylhead.cyl == 40 && track.size() == 9)
    {
        auto& sector1 = track[1];
        if (sector1.copies() == 1 && IsRainbowArtsTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Ensure the weak sector has a data CRC error, to fix broken CPCDiskXP images
                if (!sector1.has_baddatacrc())
                {
                    auto data = sector1.data_copy();
                    sector1.remove_data();
                    sector1.add(std::move(data), true);
                    if (opt.debug) util::cout << "added missing data CRC error to Rainbow Arts track\n";
                }

                // Add a second data copy with differences matching the typical weak sector
                auto data = sector1.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector1.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of Rainbow Arts weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of Rainbow Arts weak sector");
        }
    }

    // Check for missing OperaSoft 32K sector (CPDRead dumps).
    if (opt.fix != 0 && cylhead.cyl == 40 && track.size() == 9)
    {
        auto& sector7 = track[7];
        auto& sector8 = track[8];
        if (sector7.has_data() && sector8.data_size() == 0 && IsOperaSoftTrack(track))
        {
            if (opt.fix == 1)
            {
                const auto& data7 = sector7.data_copy();

                // Add 0x55 data and correct CRC for 256 bytes
                auto data8{ Data(256, 0x55) };
                data8.push_back(0xe8);
                data8.push_back(0x9f);

                // Fill up to the protection check with gap filler
                auto fill8{ Data(0x512 - data8.size(), 0x4e) };
                data8.insert(data8.end(), fill8.begin(), fill8.end());

                // Append sector 7 data to offset 0x512 to pass the protection check.
                data8.insert(data8.end(), data7.begin(), data7.end());

                // Replace any existing sector 8 data with out hand-crafted version.
                sector8.remove_data();
                sector8.add(std::move(data8), true);

                Message(msgFix, "added missing data to OperaSoft 32K sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing data in OperaSoft 32K sector");
        }
    }

    // Check for Prehistorik track followed by unused KBI-19 sectors (mastering error?).
    if (opt.fix != 0 && track.size() == 13)
    {
        if (track[6].header.sector == 12 && IsPrehistorikTrack(track))
        {
            if (opt.fix == 1)
            {
                // Trim the unwanted sectors.
                while (track.size() > 7)
                {
                    track.remove(7);
                    changed = true;
                }

                Message(msgFix, "removed unused KBI-19 sectors from end of Prehistorik track");
                changed = true;
            }
            else
                Message(msgWarning, "6 junk KBI-19 sectors found (use --fix to remove)");
        }
    }

    // Check for the problematic Reussir protection (CPC).
    if (opt.fix != 0 && track.size() == 10)
    {
        for (auto& s : track)
        {
            if (s.size() != 512 || !s.has_good_data())
                continue;

            auto& data = s.data_copy();
            if (std::memcmp(data.data(), "\0LANCE", 6))
                continue;

            // LD A,(IX+0); CP (HL); JR NZ,e
            static const uint8_t prot_check[]{ 0xdd, 0x7e, 0x00, 0xbe, 0x20 };

            for (i = 0; i < data.size() - static_cast<int>(sizeof(prot_check)); ++i)
            {
                if (data[i] == 0xdd && !memcmp(data.data() + i, prot_check, sizeof(prot_check)))
                {
                    // Are we to fix (disable) the protection?
                    if (opt.fix == 1)
                    {
                        data[i + 3] = 0xaf; // XOR A
                        Message(msgFix, "disabled problematic Reussir protection");
                    }
                    else
                        Message(msgWarning, "detected problematic Reussir protection (use --fix to disable)");
                    break;
                }
            }
        }
    }

    // Single copy of an 8K sector?
    if (opt.check8k != 0 && track.is_8k_sector() && track[0].copies() == 1 && track[0].data_size() >= 0x1801)
    {
        const auto& sector = track[0];
        const auto& data = sector.data_copy();

        static std::mutex map_mutex;
        std::lock_guard<std::mutex> lock(map_mutex);

        // The checksum method can change within a disk, but usually corresponds
        // to a change in sector id or DAM type. Fun Radio [2B] (CPC) does this.
        auto key = std::make_pair(sector.header.sector, sector.dam);
        static std::map<decltype(key), std::set<ChecksumType>> methods_map;
        auto& disk_methods = methods_map[key];

        // Determine the potential 8K checksum methods, if any.
        auto sector_methods = ChecksumMethods(data.data(), data.size());

        if (disk_methods.empty())
        {
            // First of key type follows first sector, or None.
            if (!sector_methods.empty())
                disk_methods = sector_methods;
            else
                disk_methods = { ChecksumType::None };
        }

        // Determine which common methods between disk and sector.
        std::set<ChecksumType> common_methods{};
        std::set_intersection(
            sector_methods.begin(), sector_methods.end(),
            disk_methods.begin(), disk_methods.end(),
            std::inserter(common_methods, common_methods.begin()));

        if (sector_methods.find(ChecksumType::None) != sector_methods.end())
        {
            // If None is an option, there's no checksum.
        }
        else if (common_methods.size() == 1)
        {
            // A single match means a good sector, so have the disk follow it.
            if (disk_methods.size() > 1)
                disk_methods = common_methods;
        }
        else if (disk_methods.empty())
        {
            // Unrecognised 8K method, probably the first on track containing one.
            // Ignore two matching bytes, or a single zero, as likely junk.
            if (data.size() >= 0x1802 && (data[0x1800] != data[0x1801]))
            {
                Message(msgWarning, "unknown or invalid 6K checksum [%02X %02X] on %s",
                    data[0x1800], data[0x1801], CH(cylhead.cyl, cylhead.head));
            }
            else if (data.size() >= 0x1801 && data[0x1800])
            {
                Message(msgWarning, "unknown or invalid 6K checksum [%02X] on %s",
                    data[0x1800], CH(cylhead.cyl, cylhead.head));
            }
        }
        else if (disk_methods.size() == 1 && common_methods.empty() &&
            disk_methods.find(ChecksumType::None) == disk_methods.end())
        {
            // The disk has a method, which the sector lacks. Probably bad.
            auto str_method = ChecksumName(disk_methods);
            auto checksum_len = ChecksumLength(*disk_methods.begin());

            if (checksum_len == 1 || data.size() < 0x1802)
            {
                Message(msgWarning, "invalid %s checksum [%02X] on %s",
                    str_method.c_str(), data[0x1800], CH(cylhead.cyl, cylhead.head));
            }
            else if (checksum_len == 2)
            {
                Message(msgWarning, "invalid %s checksum [%02X %02X] on %s",
                    str_method.c_str(), data[0x1800], data[0x1801],
                    CH(cylhead.cyl, cylhead.head));
            }
        }
    }

    // Return whether the supplied track was modified.
    return changed;
}